

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::Gnuplot::Gnuplot(Gnuplot *this,FILE *_fh)

{
  GnuplotTmpfileCollection *this_00;
  file_descriptor_flags local_2c;
  int local_28 [4];
  FILE *local_18;
  FILE *_fh_local;
  Gnuplot *this_local;
  
  local_18 = _fh;
  _fh_local = (FILE *)this;
  std::ios::ios((ios *)&this->field_0xc0);
  FileHandleWrapper::FileHandleWrapper(&this->super_FileHandleWrapper,local_18,false);
  *(undefined8 *)this = 0x11f1a0;
  *(undefined8 *)&this->field_0xc0 = 0x11f1c8;
  local_28[0] = FileHandleWrapper::fh_fileno(&this->super_FileHandleWrapper);
  local_2c = never_close_handle;
  boost::iostreams::
  stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>::
  stream<int,boost::iostreams::file_descriptor_flags>
            ((stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>
              *)this,&PTR_construction_vtable_24__0011f1e0,local_28,&local_2c,(type *)0x0);
  *(undefined8 *)this = 0x11f1a0;
  *(undefined8 *)&this->field_0xc0 = 0x11f1c8;
  this->feedback = (GnuplotFeedback *)0x0;
  this_00 = (GnuplotTmpfileCollection *)operator_new(0x18);
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GnuplotTmpfileCollection::GnuplotTmpfileCollection(this_00);
  std::shared_ptr<gnuplotio::GnuplotTmpfileCollection>::
  shared_ptr<gnuplotio::GnuplotTmpfileCollection,void>(&this->tmp_files,this_00);
  this->debug_messages = false;
  this->transport_tmpfile = false;
  set_stream_options(this,(ostream *)this);
  return;
}

Assistant:

explicit Gnuplot(FILE *_fh) :
        FileHandleWrapper(_fh, 0),
        boost::iostreams::stream<boost::iostreams::file_descriptor_sink>(
            fh_fileno(),
#if BOOST_VERSION >= 104400
            boost::iostreams::never_close_handle
#else
            false
#endif
        ),
        feedback(nullptr),
        tmp_files(new GnuplotTmpfileCollection()),
        debug_messages(false),
        transport_tmpfile(false)
    {
        set_stream_options(*this);
    }